

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

LabelInstr * __thiscall IR::Instr::GetOrCreateContinueLabel(Instr *this,bool isHelper)

{
  Instr *this_00;
  IRKind IVar1;
  LabelInstr *pLVar2;
  bool local_39;
  LabelInstr *label;
  bool isHelper_local;
  Instr *this_local;
  
  if (this->m_next != (Instr *)0x0) {
    this_00 = this->m_next;
    IVar1 = GetKind(this_00);
    local_39 = true;
    if (IVar1 != InstrKindLabel) {
      local_39 = IsProfiledLabelInstr(this_00);
    }
    if ((local_39 != false) &&
       (pLVar2 = AsLabelInstr(this->m_next), (bool)((byte)pLVar2->field_0x78 >> 1 & 1) == isHelper))
    {
      pLVar2 = AsLabelInstr(this->m_next);
      return pLVar2;
    }
  }
  pLVar2 = LabelInstr::New(Label,this->m_func,isHelper);
  InsertAfter(this,&pLVar2->super_Instr);
  return pLVar2;
}

Assistant:

IR::LabelInstr *
Instr::GetOrCreateContinueLabel(const bool isHelper)
{
    if (m_next && m_next->IsLabelInstr() && m_next->AsLabelInstr()->isOpHelper == isHelper)
    {
        return m_next->AsLabelInstr();
    }

    IR::LabelInstr *const label = IR::LabelInstr::New(Js::OpCode::Label, m_func, isHelper);
    InsertAfter(label);
    return label;
}